

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O0

uint64_t bitsel(uint64_t input,int8_t *bitnums,size_t size)

{
  byte bVar1;
  uint64_t uVar2;
  size_t sVar3;
  ulong uStack_28;
  int bitpos;
  uint64_t ret;
  size_t size_local;
  int8_t *bitnums_local;
  uint64_t input_local;
  
  uStack_28 = 0;
  ret = size;
  size_local = (size_t)bitnums;
  while (uVar2 = ret - 1, ret != 0) {
    sVar3 = size_local + 1;
    bVar1 = *(byte *)size_local;
    uStack_28 = uStack_28 << 1;
    ret = uVar2;
    size_local = sVar3;
    if (-1 < (char)bVar1) {
      uStack_28 = input >> (bVar1 & 0x3f) & 1 | uStack_28;
    }
  }
  return uStack_28;
}

Assistant:

static inline uint64_t bitsel(
    uint64_t input, const int8_t *bitnums, size_t size)
{
    uint64_t ret = 0;
    while (size-- > 0) {
        int bitpos = *bitnums++;
        ret <<= 1;
        if (bitpos >= 0)
            ret |= 1 & (input >> bitpos);
    }
    return ret;
}